

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall
Reducer::tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::
FunctionReferenceRemover::visitExport(wasm::Export__(void *this,Export *curr)

{
  Name *__x;
  size_type sVar1;
  Name *name;
  Export *curr_local;
  FunctionReferenceRemover *this_local;
  
  __x = wasm::Export::getInternalName(curr);
  if (__x != (Name *)0x0) {
    sVar1 = std::
            unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)((long)this + 0xd8),__x);
    if (sVar1 != 0) {
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)((long)this + 0x110),
                 (value_type *)curr);
    }
  }
  return;
}

Assistant:

void visitExport(Export* curr) {
        if (auto* name = curr->getInternalName(); name && names.count(*name)) {
          exportsToRemove.push_back(curr->name);
        }
      }